

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  local_context *ctx;
  double dVar1;
  double dVar2;
  double __y;
  FILE *theta;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  context *ctx_00;
  context *ctx_01;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long loop;
  bool bVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar18 [16];
  double dVar17;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 extraout_var [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double ret;
  compute_order compute;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  slv;
  double local_180;
  cost_type local_138;
  double local_128;
  double local_120;
  long local_118;
  bit_array_impl local_110;
  double local_100;
  compute_order local_f8;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  local_c0;
  undefined1 extraout_var_00 [56];
  
  bit_array_impl::bit_array_impl(&local_110,variables);
  ctx_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)&local_138,ctx_00,original_costs,&ctx->rng,variables);
  dVar1 = (ctx_00->parameters).kappa_step;
  local_180 = (ctx_00->parameters).delta;
  dVar2 = (ctx_00->parameters).kappa_max;
  __y = (ctx_00->parameters).alpha;
  theta = (FILE *)(ctx_00->parameters).theta;
  if (local_180 < 0.0) {
    ctx_01 = this->m_ctx;
    local_c0.super_debug_logger<true>.ofs = theta;
    info<>(ctx_01,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar15 = ZEXT816(0x7fefffffffffffff);
    }
    else {
      auVar22._8_8_ = 0x7fffffffffffffff;
      auVar22._0_8_ = 0x7fffffffffffffff;
      uVar12 = 0;
      auVar3 = ZEXT816(0x7fefffffffffffff);
      do {
        auVar25._8_8_ = 0;
        auVar25._0_8_ =
             *(double *)
              ((long)local_138.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar12 * 8);
        uVar12 = uVar12 + 1;
        auVar15 = vandpd_avx(auVar25,auVar22);
        uVar6 = vcmppd_avx512vl(auVar25,ZEXT816(0) << 0x40,4);
        uVar7 = vcmppd_avx512vl(auVar15,auVar3,1);
        bVar8 = (byte)uVar6 & 3 & (byte)uVar7 & 3;
        auVar15._0_8_ =
             (ulong)(bVar8 & 1) * auVar15._0_8_ + (ulong)!(bool)(bVar8 & 1) * auVar3._0_8_;
        auVar15._8_8_ = auVar3._8_8_;
        auVar3 = auVar15;
      } while ((uint)variables != uVar12);
    }
    local_f8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar15._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = theta;
    auVar15 = vfnmadd132sd_fma(auVar15,auVar15,auVar3);
    local_100 = auVar15._0_8_;
    info<double,double,double>
              (ctx_01,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_100,
               (double *)&local_f8,(double *)&local_c0);
    local_180 = local_100;
  }
  local_118 = (long)(ctx_00->parameters).w;
  local_120 = (ctx_00->parameters).pushing_k_factor;
  local_128 = (ctx_00->parameters).pushing_objective_amplifier;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::solver_inequalities_101coeff
            (&local_c0,&ctx->rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_138,constraints);
  compute_order::compute_order(&local_f8,(ctx_00->parameters).order,variables);
  if (((stop_task->_M_base)._M_i & 1U) == 0) {
    bVar14 = false;
    do {
      this->m_call_number = this->m_call_number + 1;
      dVar16 = best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
               ::reinit(best_recorder,ctx,bVar14,(ctx_00->parameters).kappa_min,
                        (ctx_00->parameters).kappa_max,(bit_array *)&local_110);
      compute_order::
      init<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
                (&local_f8,&local_c0,(bit_array *)&local_110);
      iVar13 = 0x7fffffff;
      if (((stop_task->_M_base)._M_i & 1U) == 0) {
        auVar20 = ZEXT864((ulong)dVar16);
        loop = 0;
        while (loop != (ctx_00->parameters).limit) {
          auVar18._0_8_ = auVar20._0_8_;
          iVar9 = compute_order::
                  run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                            (&local_f8,&local_c0,(bit_array *)&local_110,&ctx->rng,auVar18._0_8_,
                             local_180,(double)theta);
          if (iVar9 == 0) {
            dVar17 = default_cost_type<double>::results
                               (original_costs,(bit_array *)&local_110,cost_constant);
            best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
            ::try_update(best_recorder,ctx,(bit_array *)&local_110,dVar17,loop);
            bVar14 = true;
            goto LAB_0048df87;
          }
          if (iVar9 <= iVar13) {
            iVar13 = iVar9;
          }
          if (local_118 < loop) {
            auVar20._0_8_ = pow((double)iVar9 / (double)local_c0.m,__y);
            auVar20._8_56_ = extraout_var;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = auVar18._0_8_;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = dVar1;
            auVar18 = vfmadd231sd_fma(auVar23,auVar20._0_16_,auVar4);
          }
          else {
            auVar18._8_8_ = 0;
          }
          auVar20 = ZEXT1664(auVar18);
          if ((dVar2 < auVar18._0_8_) || (loop = loop + 1, ((stop_task->_M_base)._M_i & 1U) != 0))
          break;
        }
        if (0 < iVar13) goto LAB_0048df2b;
        bVar14 = false;
LAB_0048df87:
        if (((stop_task->_M_base)._M_i & 1U) == 0) {
          iVar13 = 0;
          iVar9 = 0;
          do {
            if ((ctx_00->parameters).pushes_limit <= iVar9) break;
            iVar10 = compute_order::
                     push_and_run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                               (&local_f8,&local_c0,(bit_array *)&local_110,&ctx->rng,local_120,
                                local_180,(double)theta,local_128);
            if (iVar10 == 0) {
              dVar17 = default_cost_type<double>::results
                                 (original_costs,(bit_array *)&local_110,cost_constant);
              best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
              ::try_update(best_recorder,ctx,(bit_array *)&local_110,dVar17,
                           (long)~((ctx_00->parameters).pushing_iteration_limit * iVar9));
              bVar14 = true;
            }
            if (((stop_task->_M_base)._M_i & 1U) == 0) {
              auVar20 = ZEXT864((ulong)dVar16);
              iVar10 = 1;
              while (iVar10 + -1 < (ctx_00->parameters).pushing_iteration_limit) {
                auVar19._0_8_ = auVar20._0_8_;
                iVar11 = compute_order::
                         run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                                   (&local_f8,&local_c0,(bit_array *)&local_110,&ctx->rng,
                                    auVar19._0_8_,local_180,(double)theta);
                if (iVar11 == 0) {
                  dVar17 = default_cost_type<double>::results
                                     (original_costs,(bit_array *)&local_110,cost_constant);
                  best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
                  ::try_update(best_recorder,ctx,(bit_array *)&local_110,dVar17,
                               (long)((ctx_00->parameters).pushing_iteration_limit * iVar13 - iVar10
                                     ));
                  bVar14 = true;
                  break;
                }
                if ((double)(iVar10 + -1) <= (ctx_00->parameters).w) {
                  auVar19._8_8_ = 0;
                }
                else {
                  auVar21._0_8_ = pow((double)iVar11 / (double)local_c0.m,__y);
                  auVar21._8_56_ = extraout_var_00;
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = auVar19._0_8_;
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = dVar1;
                  auVar19 = vfmadd231sd_fma(auVar24,auVar21._0_16_,auVar5);
                }
                auVar20 = ZEXT1664(auVar19);
                if ((dVar2 < auVar19._0_8_) ||
                   (iVar10 = iVar10 + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
              }
            }
            iVar9 = iVar9 + 1;
            iVar13 = iVar13 + -1;
          } while (((stop_task->_M_base)._M_i & 1U) == 0);
        }
      }
      else {
LAB_0048df2b:
        best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
        ::try_advance(best_recorder,ctx,(bit_array *)&local_110,iVar13,(ctx_00->parameters).limit);
        bVar14 = false;
      }
    } while (((stop_task->_M_base)._M_i & 1U) == 0);
  }
  if (local_f8.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::~solver_inequalities_101coeff(&local_c0);
  if ((_Head_base<0UL,_double_*,_false>)
      local_138.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_138.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if (local_110.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_110.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }